

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O2

void psh_hint_table_activate_mask(PSH_Hint_Table table,PS_Mask hint_mask)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  PSH_Hint_conflict pPVar4;
  PSH_Hint_conflict *ppPVar5;
  byte *pbVar6;
  ulong uVar7;
  FT_UInt *pFVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar15;
  bool bVar16;
  ulong uVar14;
  
  pbVar6 = hint_mask->bytes;
  uVar1 = hint_mask->num_bits;
  uVar2 = table->max_hints;
  pFVar8 = &table->hints->flags;
  uVar10 = uVar2;
  while (bVar16 = uVar10 != 0, uVar10 = uVar10 - 1, bVar16) {
    *(byte *)pFVar8 = (byte)*pFVar8 & 0xfb;
    pFVar8[4] = -1;
    pFVar8 = pFVar8 + 0xc;
  }
  uVar10 = 0;
  uVar15 = 0;
  uVar14 = 0;
  for (lVar11 = 0; uVar13 = (uint)uVar14, (ulong)uVar1 * 0x30 - lVar11 != 0; lVar11 = lVar11 + 0x30)
  {
    if (uVar15 == 0) {
      uVar10 = (uint)*pbVar6;
      pbVar6 = pbVar6 + 1;
      uVar15 = 0x80;
    }
    uVar7 = uVar14;
    if ((uVar15 & uVar10) != 0) {
      pPVar4 = table->hints;
      uVar3 = *(uint *)((long)&pPVar4->flags + lVar11);
      if (((uVar3 & 4) == 0) &&
         (*(uint *)((long)&pPVar4->flags + lVar11) = uVar3 | 4, uVar13 < uVar2)) {
        uVar7 = (ulong)(uVar13 + 1);
        table->sort[uVar14] = (PSH_Hint_conflict)((long)&pPVar4->org_pos + lVar11);
      }
    }
    uVar15 = uVar15 >> 1;
    uVar14 = uVar7;
  }
  table->num_hints = uVar13;
  ppPVar5 = table->sort;
  for (uVar7 = 1; uVar7 < uVar14; uVar7 = uVar7 + 1) {
    pPVar4 = ppPVar5[uVar7];
    uVar9 = uVar7 & 0xffffffff;
    while ((uVar12 = (ulong)((int)uVar9 - 1), uVar12 < uVar7 &&
           (pPVar4->org_pos <= ppPVar5[uVar12]->org_pos))) {
      ppPVar5[uVar9] = ppPVar5[uVar12];
      ppPVar5[uVar12] = pPVar4;
      uVar9 = uVar12;
    }
  }
  return;
}

Assistant:

static void
  psh_hint_table_activate_mask( PSH_Hint_Table  table,
                                PS_Mask         hint_mask )
  {
    FT_Int    mask = 0, val = 0;
    FT_Byte*  cursor = hint_mask->bytes;
    FT_UInt   idx, limit, count;


    limit = hint_mask->num_bits;
    count = 0;

    psh_hint_table_deactivate( table );

    for ( idx = 0; idx < limit; idx++ )
    {
      if ( mask == 0 )
      {
        val  = *cursor++;
        mask = 0x80;
      }

      if ( val & mask )
      {
        PSH_Hint  hint = &table->hints[idx];


        if ( !psh_hint_is_active( hint ) )
        {
          FT_UInt     count2;

#if 0
          PSH_Hint*  sort = table->sort;
          PSH_Hint   hint2;


          for ( count2 = count; count2 > 0; count2--, sort++ )
          {
            hint2 = sort[0];
            if ( psh_hint_overlap( hint, hint2 ) )
              FT_TRACE0(( "psh_hint_table_activate_mask:"
                          " found overlapping hints\n" ))
          }
#else
          count2 = 0;
#endif

          if ( count2 == 0 )
          {
            psh_hint_activate( hint );
            if ( count < table->max_hints )
              table->sort[count++] = hint;
            else
              FT_TRACE0(( "psh_hint_tableactivate_mask:"
                          " too many active hints\n" ));
          }
        }
      }

      mask >>= 1;
    }
    table->num_hints = count;

    /* now, sort the hints; they are guaranteed to not overlap */
    /* so we can compare their "org_pos" field directly        */
    {
      FT_UInt    i1, i2;
      PSH_Hint   hint1, hint2;
      PSH_Hint*  sort = table->sort;


      /* a simple bubble sort will do, since in 99% of cases, the hints */
      /* will be already sorted -- and the sort will be linear          */
      for ( i1 = 1; i1 < count; i1++ )
      {
        hint1 = sort[i1];
        /* this loop stops when i2 wraps around after reaching 0 */
        for ( i2 = i1 - 1; i2 < i1; i2-- )
        {
          hint2 = sort[i2];

          if ( hint2->org_pos < hint1->org_pos )
            break;

          sort[i2 + 1] = hint2;
          sort[i2]     = hint1;
        }
      }
    }
  }